

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

Value * duckdb::AllowedDirectoriesSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  _Rb_tree_node_base *p_Var2;
  vector<duckdb::Value,_true> allowed_directories;
  pointer local_68;
  pointer pVStack_60;
  pointer local_58;
  LogicalType local_50;
  vector<duckdb::Value,_true> local_38;
  
  pDVar1 = DBConfig::GetConfig(context);
  local_68 = (pointer)0x0;
  pVStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  for (p_Var2 = (pDVar1->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(pDVar1->options).allowed_directories._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  }
  LogicalType::LogicalType(&local_50,VARCHAR);
  local_38.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68;
  local_38.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_60;
  local_38.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_58;
  local_68 = (pointer)0x0;
  pVStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  Value::LIST(__return_storage_ptr__,&local_50,&local_38);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_38);
  LogicalType::~LogicalType(&local_50);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Value AllowedDirectoriesSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	vector<Value> allowed_directories;
	for (auto &dir : config.options.allowed_directories) {
		allowed_directories.emplace_back(dir);
	}
	return Value::LIST(LogicalType::VARCHAR, std::move(allowed_directories));
}